

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O0

int dup_bn_into(BIGNUM **out,BIGNUM *src)

{
  bool bVar1;
  BIGNUM *__p;
  pointer pbVar2;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_28;
  UniquePtr<BIGNUM> a;
  BIGNUM *src_local;
  BIGNUM **out_local;
  
  a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)src;
  __p = BN_dup((BIGNUM *)src);
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_28,(pointer)__p);
  bVar1 = std::operator==(&local_28,(nullptr_t)0x0);
  if (!bVar1) {
    BN_free((BIGNUM *)*out);
    pbVar2 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::release(&local_28);
    *out = pbVar2;
  }
  out_local._4_4_ = (uint)!bVar1;
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return out_local._4_4_;
}

Assistant:

static int dup_bn_into(BIGNUM **out, BIGNUM *src) {
  bssl::UniquePtr<BIGNUM> a(BN_dup(src));
  if (a == nullptr) {
    return 0;
  }
  BN_free(*out);
  *out = a.release();
  return 1;
}